

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::convertImpliedInteger
          (HPresolve *this,HighsInt col,HighsInt row,bool skipInputChecks)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  char *pcVar5;
  byte in_CL;
  int in_EDX;
  int __c;
  int in_ESI;
  iterator *rhs;
  long *in_RDI;
  HPresolve *unaff_retaddr;
  HighsSliceNonzero *nonzero;
  iterator __end2;
  iterator __begin2;
  HighsTripletListSlice *__range2;
  HighsInt in_stack_000000e4;
  HPresolve *in_stack_000000e8;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff60;
  vector<int,_std::allocator<int>_> *this_01;
  HighsInt in_stack_ffffffffffffff8c;
  HPresolve *in_stack_ffffffffffffff90;
  iterator local_68;
  undefined1 local_48 [32];
  undefined1 *local_28;
  byte local_19;
  int local_18;
  int local_14;
  long *newLower;
  HighsInt in_stack_fffffffffffffffc;
  
  local_19 = in_CL & 1;
  local_18 = in_EDX;
  local_14 = in_ESI;
  newLower = in_RDI;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                      (long)in_ESI);
  if (*pvVar2 == '\0') {
    if (((local_19 & 1) != 0) ||
       ((pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                             (*in_RDI + 0x178),(long)local_14), *pvVar3 == kContinuous &&
        (bVar1 = isImpliedInteger(in_stack_000000e8,in_stack_000000e4), bVar1)))) {
      pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                          (long)local_14);
      *pvVar3 = kImplicitInteger;
      if (local_18 == -1) {
        getColumnVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        local_28 = local_48;
        HighsMatrixSlice<HighsTripletListSlice>::begin(in_stack_ffffffffffffff60);
        HighsMatrixSlice<HighsTripletListSlice>::end(in_stack_ffffffffffffff60);
        while( true ) {
          rhs = (iterator *)&stack0xffffffffffffff78;
          bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_68,rhs);
          if (!bVar1) break;
          this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_68);
          this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x26);
          pcVar5 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar5);
          *pvVar4 = *pvVar4 + 1;
          HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_68);
        }
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x26),(long)local_18);
        *pvVar4 = *pvVar4 + 1;
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
      changeColLower(unaff_retaddr,in_stack_fffffffffffffffc,(double)newLower);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
      changeColUpper(unaff_retaddr,in_stack_fffffffffffffffc,(double)newLower);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HPresolve::convertImpliedInteger(HighsInt col, HighsInt row,
                                      bool skipInputChecks) {
  // return if column was deleted
  if (colDeleted[col]) return false;

  // return if column is not continuous or cannot be converted to an implied
  // integer
  if (!skipInputChecks &&
      (model->integrality_[col] != HighsVarType::kContinuous ||
       !isImpliedInteger(col)))
    return false;

  // convert to implied integer
  model->integrality_[col] = HighsVarType::kImplicitInteger;

  if (row != -1) {
    // use row index supplied by caller (e.g. singleton)
    ++rowsizeImplInt[row];
  } else {
    // iterate over rows
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      ++rowsizeImplInt[nonzero.index()];
  }

  // round and update bounds
  changeColLower(col, model->col_lower_[col]);
  changeColUpper(col, model->col_upper_[col]);
  return true;
}